

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::SetEmailLogging(LogSeverity min_severity,char *addresses)

{
  std::mutex::lock((mutex *)log_mutex);
  LogDestination::email_logging_severity_ = min_severity;
  std::__cxx11::string::assign(LogDestination::addresses__abi_cxx11_);
  pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
  return;
}

Assistant:

void SetEmailLogging(LogSeverity min_severity, const char* addresses) {
  LogDestination::SetEmailLogging(min_severity, addresses);
}